

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSession::SendRTCPAPPPacket
          (RTPSession *this,uint8_t subtype,uint8_t *name,void *appdata,size_t appdatalen)

{
  RTPMemoryManager *mgr;
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *owncname;
  size_t owncnamelen;
  undefined1 local_170 [8];
  RTCPCompoundPacketBuilder pb;
  uint32_t ssrc;
  int status;
  size_t appdatalen_local;
  void *appdata_local;
  uint8_t *name_local;
  uint8_t subtype_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    pb.appsize._0_4_ = RTPPacketBuilder::GetSSRC(&this->packetbuilder);
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder((RTCPCompoundPacketBuilder *)local_170,mgr)
    ;
    pb.appsize._4_4_ =
         RTCPCompoundPacketBuilder::InitBuild
                   ((RTCPCompoundPacketBuilder *)local_170,this->maxpacksize);
    this_local._4_4_ = pb.appsize._4_4_;
    if (((-1 < pb.appsize._4_4_) &&
        (pb.appsize._4_4_ =
              RTCPCompoundPacketBuilder::StartReceiverReport
                        ((RTCPCompoundPacketBuilder *)local_170,(uint32_t)pb.appsize),
        this_local._4_4_ = pb.appsize._4_4_, -1 < pb.appsize._4_4_)) &&
       (pb.appsize._4_4_ =
             RTCPCompoundPacketBuilder::AddSDESSource
                       ((RTCPCompoundPacketBuilder *)local_170,(uint32_t)pb.appsize),
       this_local._4_4_ = pb.appsize._4_4_, -1 < pb.appsize._4_4_)) {
      owncname = (uint8_t *)0x0;
      puVar1 = RTCPPacketBuilder::GetLocalCNAME(&this->rtcpbuilder,(size_t *)&owncname);
      pb.appsize._4_4_ =
           RTCPCompoundPacketBuilder::AddSDESNormalItem
                     ((RTCPCompoundPacketBuilder *)local_170,CNAME,puVar1,(uint8_t)owncname);
      this_local._4_4_ = pb.appsize._4_4_;
      if (((-1 < pb.appsize._4_4_) &&
          (pb.appsize._4_4_ =
                RTCPCompoundPacketBuilder::AddAPPPacket
                          ((RTCPCompoundPacketBuilder *)local_170,subtype,(uint32_t)pb.appsize,name,
                           appdata,appdatalen), this_local._4_4_ = pb.appsize._4_4_,
          -1 < pb.appsize._4_4_)) &&
         (pb.appsize._4_4_ =
               RTCPCompoundPacketBuilder::EndBuild((RTCPCompoundPacketBuilder *)local_170),
         this_local._4_4_ = pb.appsize._4_4_, -1 < pb.appsize._4_4_)) {
        puVar1 = RTCPCompoundPacket::GetCompoundPacketData((RTCPCompoundPacket *)local_170);
        sVar2 = RTCPCompoundPacket::GetCompoundPacketLength((RTCPCompoundPacket *)local_170);
        pb.appsize._4_4_ = SendRTCPData(this,puVar1,sVar2);
        this_local._4_4_ = pb.appsize._4_4_;
        if (-1 < pb.appsize._4_4_) {
          this->sentpackets = true;
          sVar2 = RTCPCompoundPacket::GetCompoundPacketLength((RTCPCompoundPacket *)local_170);
          this_local._4_4_ = (int)sVar2;
        }
      }
    }
    owncnamelen._0_4_ = 1;
    RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder((RTCPCompoundPacketBuilder *)local_170);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SendRTCPAPPPacket(uint8_t subtype, const uint8_t name[4], const void *appdata, size_t appdatalen)
{
	int status;

	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	BUILDER_LOCK
	uint32_t ssrc = packetbuilder.GetSSRC();
	BUILDER_UNLOCK
	
	RTCPCompoundPacketBuilder pb(GetMemoryManager());

	status = pb.InitBuild(maxpacksize);
	
	if(status < 0)
		return status;

	//first packet in an rtcp compound packet should always be SR or RR
	if((status = pb.StartReceiverReport(ssrc)) < 0)
		return status;

	//add SDES packet with CNAME item
	if ((status = pb.AddSDESSource(ssrc)) < 0)
		return status;
	
	BUILDER_LOCK
	size_t owncnamelen = 0;
	uint8_t *owncname = rtcpbuilder.GetLocalCNAME(&owncnamelen);

	if ((status = pb.AddSDESNormalItem(RTCPSDESPacket::CNAME,owncname,owncnamelen)) < 0)
	{
		BUILDER_UNLOCK
		return status;
	}
	BUILDER_UNLOCK
	
	//add our application specific packet
	if((status = pb.AddAPPPacket(subtype, ssrc, name, appdata, appdatalen)) < 0)
		return status;

	if((status = pb.EndBuild()) < 0)
		return status;

	//send packet
	status = SendRTCPData(pb.GetCompoundPacketData(),pb.GetCompoundPacketLength());
	if(status < 0)
		return status;

	PACKSENT_LOCK
	sentpackets = true;
	PACKSENT_UNLOCK

	return pb.GetCompoundPacketLength();
}